

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

Gia_Man_t *
Gia_ManSpecReduceInitFrames
          (Gia_Man_t *p,Abc_Cex_t *pInit,int nFramesMax,int *pnFrames,int fDualOut,int nMinOutputs)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *p_00;
  int local_44;
  int nLits;
  int f;
  Gia_Man_t *pFrames;
  int nMinOutputs_local;
  int fDualOut_local;
  int *pnFrames_local;
  int nFramesMax_local;
  Abc_Cex_t *pInit_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManEquivCountLits(p);
  for (local_44 = 1;
      (((p_00 = Gia_ManSpecReduceInit(p,pInit,local_44,fDualOut), nMinOutputs != 0 ||
        (iVar2 = Gia_ManPoNum(p_00), iVar2 < iVar1 / 2 + 1)) &&
       ((nMinOutputs == 0 || (iVar2 = Gia_ManPoNum(p_00), iVar2 < nMinOutputs)))) &&
      (local_44 != nFramesMax)); local_44 = local_44 + 1) {
    iVar2 = Gia_ManAndNum(p_00);
    if (500000 < iVar2) {
      Gia_ManStop(p_00);
      return (Gia_Man_t *)0x0;
    }
    Gia_ManStop(p_00);
  }
  if (local_44 == nFramesMax) {
    Abc_Print(1,"Stopped unrolling after %d frames.\n",(ulong)(uint)nFramesMax);
  }
  if (pnFrames == (int *)0x0) {
    return p_00;
  }
  *pnFrames = local_44;
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManSpecReduceInitFrames( Gia_Man_t * p, Abc_Cex_t * pInit, int nFramesMax, int * pnFrames, int fDualOut, int nMinOutputs )
{
    Gia_Man_t * pFrames;
    int f, nLits;
    nLits = Gia_ManEquivCountLits( p );
    for ( f = 1; ; f++ )
    {
        pFrames = Gia_ManSpecReduceInit( p, pInit, f, fDualOut );
        if ( (nMinOutputs == 0 && Gia_ManPoNum(pFrames) >= nLits/2+1) ||
             (nMinOutputs != 0 && Gia_ManPoNum(pFrames) >= nMinOutputs) )
            break;
        if ( f == nFramesMax )
            break;
        if ( Gia_ManAndNum(pFrames) > 500000 )
        {
            Gia_ManStop( pFrames );
            return NULL;
        }
        Gia_ManStop( pFrames );
        pFrames = NULL;
    }
    if ( f == nFramesMax )
        Abc_Print( 1, "Stopped unrolling after %d frames.\n", nFramesMax );
    if ( pnFrames )
        *pnFrames = f;
    return pFrames;
}